

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

bool __thiscall TRM::Edge::intersect(Edge *this,Edge *other,vec2 *point)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double scale;
  double t_number;
  double s_number;
  double dy;
  double dx;
  double denom;
  vec2 *point_local;
  Edge *other_local;
  Edge *this_local;
  
  if ((((this->top == other->top) || (this->bottom == other->bottom)) ||
      (this->top == other->bottom)) || (this->bottom == other->top)) {
    return false;
  }
  pfVar3 = std::min<float>((float *)&this->top->point,(float *)&this->bottom->point);
  fVar1 = *pfVar3;
  pfVar3 = std::max<float>((float *)&other->top->point,(float *)&other->bottom->point);
  if (fVar1 < *pfVar3 || fVar1 == *pfVar3) {
    pfVar3 = std::max<float>((float *)&this->top->point,(float *)&this->bottom->point);
    fVar1 = *pfVar3;
    pfVar3 = std::min<float>((float *)&other->top->point,(float *)&other->bottom->point);
    if (*pfVar3 <= fVar1) {
      pfVar3 = std::min<float>(&(this->top->point).field_1.y,&(this->bottom->point).field_1.y);
      fVar1 = *pfVar3;
      pfVar3 = std::max<float>(&(other->top->point).field_1.y,&(other->bottom->point).field_1.y);
      if (fVar1 < *pfVar3 || fVar1 == *pfVar3) {
        pfVar3 = std::max<float>(&(this->top->point).field_1.y,&(this->bottom->point).field_1.y);
        fVar1 = *pfVar3;
        pfVar3 = std::min<float>(&(other->top->point).field_1.y,&(other->bottom->point).field_1.y);
        if (*pfVar3 <= fVar1) {
          dVar4 = this->le_a * other->le_b + -(this->le_b * other->le_a);
          if ((dVar4 == 0.0) && (!NAN(dVar4))) {
            return false;
          }
          dVar5 = (double)(other->top->point).field_0.x - (double)(this->top->point).field_0.x;
          dVar6 = (double)(other->top->point).field_1.y - (double)(this->top->point).field_1.y;
          dVar7 = dVar6 * other->le_b + dVar5 * other->le_a;
          dVar5 = dVar6 * this->le_b + dVar5 * this->le_a;
          if (dVar4 <= 0.0) {
            if (0.0 < dVar7) {
              return false;
            }
            if (dVar7 < dVar4) {
              return false;
            }
            if (0.0 < dVar5) {
              return false;
            }
            if (dVar5 < dVar4) {
              return false;
            }
          }
          else if (((dVar7 < 0.0) || (dVar4 < dVar7)) || ((dVar5 < 0.0 || (dVar4 < dVar5)))) {
            return false;
          }
          dVar5 = -(dVar7 * this->le_b) * (1.0 / dVar4) + (double)(this->top->point).field_0.x;
          dVar5 = std::round((double)CONCAT44((int)((ulong)dVar5 >> 0x20),(float)dVar5));
          point->field_0 = SUB84(dVar5,0);
          dVar4 = dVar7 * this->le_a * (1.0 / dVar4) + (double)(this->top->point).field_1.y;
          dVar4 = std::round((double)CONCAT44((int)((ulong)dVar4 >> 0x20),(float)dVar4));
          point->field_1 = SUB84(dVar4,0);
          uVar2 = std::isinf((double)(ulong)(uint)point->field_0);
          if (((uVar2 & 1) == 0) &&
             (uVar2 = std::isinf((double)(ulong)(uint)point->field_1), (uVar2 & 1) == 0)) {
            return true;
          }
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Edge::intersect(Edge* other, glm::vec2* point) {
  if (top == other->top || bottom == other->bottom || top == other->bottom ||
      bottom == other->top) {
    return false;
  }

  // check if two aabb bounds is intersect
  if (std::min(top->point.x, bottom->point.x) >
          std::max(other->top->point.x, other->bottom->point.x) ||
      std::max(top->point.x, bottom->point.x) <
          std::min(other->top->point.x, other->bottom->point.x) ||
      std::min(top->point.y, bottom->point.y) >
          std::max(other->top->point.y, other->bottom->point.y) ||
      std::max(top->point.y, bottom->point.y) <
          std::min(other->top->point.y, other->bottom->point.y)) {
    return false;
  }

  double denom = le_a * other->le_b - le_b * other->le_a;

  if (denom == 0.0) {
    return false;
  }

  double dx = static_cast<double>(other->top->point.x) - top->point.x;
  double dy = static_cast<double>(other->top->point.y) - top->point.y;

  double s_number = dy * other->le_b + dx * other->le_a;
  double t_number = dy * le_b + dx * le_a;

  if (denom > 0.0 ? (s_number < 0.0 || s_number > denom || t_number < 0.0 ||
                     t_number > denom)
                  : (s_number > 0.0 || s_number < denom || t_number > 0.0 ||
                     t_number < denom)) {
    return false;
  }

  double scale = 1.0 / denom;

  point->x = glm::round(
      static_cast<float>(top->point.x - s_number * le_b * scale));
  point->y = glm::round(
      static_cast<float>(top->point.y + s_number * le_a * scale));

  if (glm::isinf(point->x) || glm::isinf(point->y)) {
    return false;
  }

  return true;
}